

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this,void **vtt)

{
  void **vtt_local;
  IfcStructuralPointAction *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPointAction,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcStructuralPointAction,_0UL> *)
             &(this->super_IfcStructuralAction).field_0x178,vtt + 0x28);
  IfcStructuralAction::~IfcStructuralAction(&this->super_IfcStructuralAction,vtt + 1);
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}